

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.hpp
# Opt level: O1

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
openjij::utility::gen_matrix_from_trotter_spins<double,0>
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,utility *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *trotter_spins)

{
  ulong rows;
  long *plVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  undefined1 auVar6 [16];
  ulong cols;
  undefined8 *puVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  plVar1 = *(long **)this;
  plVar2 = *(long **)(this + 8);
  lVar8 = plVar1[1] - *plVar1 >> 2;
  rows = lVar8 + 1;
  cols = ((long)plVar2 - (long)plVar1 >> 3) * -0x5555555555555555;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  if ((long)(cols | rows) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if (((plVar2 != plVar1) && (rows != 0)) &&
     (auVar6 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar6 / SEXT816((long)cols),0) <= lVar8)) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8,lVar8,SUB168(auVar6 % SEXT816((long)cols),0));
    *puVar7 = dup2;
    __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,cols * rows,rows,cols);
  plVar1 = *(long **)this;
  plVar2 = *(long **)(this + 8);
  lVar8 = ((long)plVar2 - (long)plVar1 >> 3) * -0x5555555555555555;
  if (plVar2 != plVar1) {
    lVar9 = 0;
    lVar10 = 0;
    do {
      lVar3 = plVar1[lVar10 * 3];
      lVar11 = plVar1[lVar10 * 3 + 1] - lVar3;
      if (lVar11 != 0) {
        lVar11 = lVar11 >> 2;
        lVar4 = (__return_storage_ptr__->
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
        pdVar5 = (__return_storage_ptr__->
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
        lVar12 = 0;
        do {
          if (((lVar10 < 0) || (lVar4 <= lVar12)) ||
             ((__return_storage_ptr__->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols <=
              lVar10)) goto LAB_0013f057;
          *(double *)((long)pdVar5 + lVar12 * 8 + lVar4 * lVar9) =
               (double)*(int *)(lVar3 + lVar12 * 4);
          lVar12 = lVar12 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != lVar12);
      }
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 8;
    } while (lVar10 != lVar8 + (ulong)(lVar8 == 0));
  }
  if (plVar2 != plVar1) {
    lVar9 = plVar1[1] - *plVar1 >> 2;
    if ((lVar9 < 0) ||
       (lVar10 = (__return_storage_ptr__->
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows,
       lVar10 <= lVar9)) {
LAB_0013f057:
      __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                   );
    }
    puVar7 = (undefined8 *)
             ((plVar1[1] - *plVar1) * 2 +
             (long)(__return_storage_ptr__->
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                   m_data);
    lVar9 = 0;
    do {
      if ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_cols <= lVar9) goto LAB_0013f057;
      *puVar7 = 0x3ff0000000000000;
      lVar9 = lVar9 + 1;
      puVar7 = puVar7 + lVar10;
    } while (lVar8 + (ulong)(lVar8 == 0) != lVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

inline static Eigen::Matrix<FloatType, Eigen::Dynamic, Eigen::Dynamic, Options>
gen_matrix_from_trotter_spins(const std::vector<graph::Spins> &trotter_spins) {
  Eigen::Matrix<FloatType, Eigen::Dynamic, Eigen::Dynamic, Options> ret_mat(
      trotter_spins[0].size() + 1, trotter_spins.size());

  // initialize spin
  for (size_t j = 0; j < trotter_spins.size(); j++) {
    for (size_t i = 0; i < trotter_spins[j].size(); i++) {
      ret_mat(i, j) = trotter_spins[j][i];
    }
  }

  // dummy spins
  for (size_t j = 0; j < trotter_spins.size(); j++) {
    ret_mat(trotter_spins[0].size(), j) = 1;
  }

  return ret_mat;
}